

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fpu_helper.c
# Opt level: O1

int float_comp_to_cc(CPUS390XState_conflict *env,int float_compare)

{
  if (float_compare + 1U < 4) {
    return *(int *)(&DAT_00dc81b0 + (ulong)(float_compare + 1U) * 4);
  }
  cpu_abort_s390x((CPUState *)(env[-0x1e].vregs + 0xf),"unknown return value for float compare\n");
}

Assistant:

int float_comp_to_cc(CPUS390XState *env, int float_compare)
{
    switch (float_compare) {
    case float_relation_equal:
        return 0;
    case float_relation_less:
        return 1;
    case float_relation_greater:
        return 2;
    case float_relation_unordered:
        return 3;
    default:
        cpu_abort(env_cpu(env), "unknown return value for float compare\n");
    }
}